

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

int lyds_compare_single(lyd_node *node1,lyd_node *node2)

{
  lysc_node *plVar1;
  int iVar2;
  
  if ((((node1 != (lyd_node *)0x0) && (node2 != (lyd_node *)0x0)) &&
      (plVar1 = node1->schema, plVar1 != (lysc_node *)0x0)) &&
     ((plVar1 == node2->schema && ((char)plVar1->flags < '\0')))) {
    if (plVar1->nodetype == 8) {
      if (node1 != node2) {
        iVar2 = rb_compare_leaflists(node1,node2);
        return iVar2;
      }
    }
    else {
      if ((plVar1->nodetype != 0x10) || ((plVar1->flags >> 9 & 1) != 0)) goto LAB_00155f22;
      if (node1 != node2) {
        iVar2 = rb_compare_lists(node1,node2);
        return iVar2;
      }
    }
    return 0;
  }
LAB_00155f22:
  __assert_fail("node1 && node2 && (node1->schema == node2->schema) && lyds_is_supported(node1)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                ,0x6c5,"int lyds_compare_single(struct lyd_node *, struct lyd_node *)");
}

Assistant:

int
lyds_compare_single(struct lyd_node *node1, struct lyd_node *node2)
{
    assert(node1 && node2 && (node1->schema == node2->schema) && lyds_is_supported(node1));

    if (node1 == node2) {
        return 0;
    } else if (node1->schema->nodetype == LYS_LEAFLIST) {
        return rb_compare_leaflists(node1, node2);
    } else {
        return rb_compare_lists(node1, node2);
    }
}